

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O3

value * mjs::anon_unknown_110::array_reduce
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                  value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args,
                  bool reduce_right)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  long *plVar5;
  undefined8 *puVar6;
  global_object *pgVar7;
  object *poVar8;
  value *extraout_RAX;
  native_error_exception *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar9;
  undefined8 extraout_RDX_06;
  uint uVar10;
  pointer pvVar11;
  undefined3 in_register_00000081;
  long lVar12;
  initializer_list<mjs::value> __l;
  object_ptr o;
  wstring is_1;
  wstring is;
  value callback;
  allocator_type local_191;
  value *local_190;
  undefined4 local_184;
  gc_heap_ptr_untyped local_180;
  undefined1 local_170 [32];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  value local_120;
  undefined1 local_f8 [40];
  undefined4 local_d0;
  double local_c8;
  undefined4 local_a8;
  gc_heap_ptr_untyped local_a0 [2];
  gc_heap *local_80;
  gc_heap *local_78;
  value local_70;
  vector<mjs::value,_std::allocator<mjs::value>_> local_48;
  
  local_184 = CONCAT31(in_register_00000081,reduce_right);
  local_190 = __return_storage_ptr__;
  plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar5 + 0x88))(&local_180,plVar5,this_);
  puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&local_180);
  local_70.type_ = reference;
  local_70._4_4_ = 0;
  local_70.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x1b0488;
  (**(code **)*puVar6)(&local_120,puVar6);
  uVar4 = to_uint32(&local_120);
  value::destroy(&local_120);
  pvVar11 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pvVar11 ==
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar11 = (pointer)&value::undefined;
  }
  value::value(&local_70,pvVar11);
  pgVar7 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  plVar5 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar5 + 0x60))(&local_120,plVar5);
  global_object::validate_type(pgVar7,&local_70,(object_ptr *)&local_120,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_120);
  value::value(local_190,(value *)&value::undefined);
  pvVar11 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) * -0x3333333333333333)
      < 2) {
    uVar10 = 0;
    uVar9 = extraout_RDX;
    uVar1 = uVar4;
    local_140._24_8_ = global;
    do {
      uVar1 = uVar1 - 1;
      if (uVar1 == 0xffffffff) {
        this = (native_error_exception *)__cxa_allocate_exception(0x58);
        pgVar7 = (global_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_140._24_8_);
        global_object::stack_trace_abi_cxx11_((wstring *)&local_120,pgVar7);
        local_150._0_8_ = local_120.field_1.n_;
        local_150._8_8_ = local_120._0_8_;
        local_170._0_8_ = (pointer)0x19;
        local_170._8_8_ = "cannot reduce empty array";
        native_error_exception::native_error_exception
                  (this,type,(wstring_view *)local_150,(string_view *)local_170);
        __cxa_throw(this,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
      uVar2 = uVar10;
      if ((char)local_184 != '\0') {
        uVar2 = uVar1;
      }
      index_string_abi_cxx11_((wstring *)local_150,(mjs *)(ulong)uVar2,(uint32_t)uVar9);
      poVar8 = (object *)gc_heap_ptr_untyped::get(&local_180);
      local_120._0_8_ = local_150._8_8_;
      local_120.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)local_150._0_8_;
      bVar3 = object::has_property(poVar8,(wstring_view *)&local_120);
      uVar9 = extraout_RDX_01;
      if (bVar3) {
        puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&local_180);
        local_170._0_8_ = local_150._8_8_;
        local_170._8_8_ = local_150._0_8_;
        (**(code **)*puVar6)(&local_120,puVar6,local_170);
        value::operator=(local_190,&local_120);
        value::destroy(&local_120);
        uVar9 = extraout_RDX_02;
      }
      if ((gc_heap *)local_150._0_8_ != (gc_heap *)local_140) {
        operator_delete((void *)local_150._0_8_,local_140._0_8_ * 4 + 4);
        uVar9 = extraout_RDX_03;
      }
      uVar10 = uVar10 + 1;
    } while (!bVar3);
  }
  else {
    uVar10 = 0;
    value::operator=(local_190,pvVar11 + 1);
    uVar9 = extraout_RDX_00;
  }
  if (uVar10 < uVar4) {
    do {
      uVar1 = ~uVar10 + uVar4;
      if ((char)local_184 == '\0') {
        uVar1 = uVar10;
      }
      index_string_abi_cxx11_((wstring *)local_170,(mjs *)(ulong)uVar1,(uint32_t)uVar9);
      poVar8 = (object *)gc_heap_ptr_untyped::get(&local_180);
      local_120._0_8_ = local_170._8_8_;
      local_120.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)local_170._0_8_;
      bVar3 = object::has_property(poVar8,(wstring_view *)&local_120);
      uVar9 = extraout_RDX_04;
      if (bVar3) {
        value::value(&local_120,local_190);
        puVar6 = (undefined8 *)gc_heap_ptr_untyped::get(&local_180);
        local_80 = (gc_heap *)local_170._8_8_;
        local_78 = (gc_heap *)local_170._0_8_;
        (**(code **)*puVar6)(local_f8,puVar6,&local_80);
        local_c8 = (double)uVar1;
        local_d0 = 3;
        local_a8 = 5;
        local_a0[0].heap_ = local_180.heap_;
        local_a0[0].pos_ = local_180.pos_;
        if (local_180.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_180.heap_,local_a0);
        }
        __l._M_len = 4;
        __l._M_array = &local_120;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_48,__l,&local_191);
        call_function((value *)local_150,&local_70,(value *)&value::undefined,&local_48);
        value::operator=(local_190,(value *)local_150);
        value::destroy((value *)local_150);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_48);
        lVar12 = 0x78;
        do {
          value::destroy((value *)((long)&local_120.type_ + lVar12));
          lVar12 = lVar12 + -0x28;
          uVar9 = extraout_RDX_05;
        } while (lVar12 != -0x28);
      }
      if ((gc_heap *)local_170._0_8_ != (gc_heap *)(local_170 + 0x10)) {
        operator_delete((void *)local_170._0_8_,local_170._16_8_ * 4 + 4);
        uVar9 = extraout_RDX_06;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar4);
  }
  value::destroy(&local_70);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
  return extraout_RAX;
}

Assistant:

value array_reduce(gc_heap_ptr<global_object> global, const value& this_, const std::vector<value>& args, bool reduce_right) {
    auto o = global->to_object(this_);
    const auto len = to_uint32(o->get(L"length"));
    const auto callback = !args.empty() ? args[0] : value::undefined;
    global->validate_type(callback, global->function_prototype(), "function");

    value accumulator = value::undefined;
    // i always counts from 0 to len-1 (inclusive)
    uint32_t i = 0;
    // k() is the index to use (same as i if left reducing)
    auto k = [&i, len, reduce_right]() { return reduce_right ? len - 1 - i : i; };

    if (args.size() > 1) {
        // 7. initialValue is present
        accumulator = args[1];
    } else {
        // 6. len is 0 and initialValue is not present
        // 8. initialValue is not present
        for (;;) {
            if (i == len) {
                throw native_error_exception{native_error_type::type, global->stack_trace(), "cannot reduce empty array"};
            }
            const auto is = index_string(k());
            ++i; // increase i after having called k() for this loop but before breaking (since the value was consumed)
            if (o->has_property(is)) {
                accumulator = o->get(is);
                break;
            }
        }
    }

    for (; i < len; ++i) {
        const auto is = index_string(k());
        if (o->has_property(is)) {
            accumulator = call_function(callback, value::undefined, { accumulator, o->get(is), value{static_cast<double>(k())}, value{o} });
        }
    }

    return accumulator;
}